

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# q2.cpp
# Opt level: O1

BSTree<const_int_&,_int>
bstree_from_sorted<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>
          (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *begin,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *end,
          int *default_value)

{
  long in_RCX;
  BSTree<const_int_&,_int> bst;
  Function inserter;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  long *local_48;
  undefined8 uStack_40;
  code *local_38;
  code *pcStack_30;
  
  local_50._M_current = (int *)0x0;
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48 = (long *)0x0;
  uStack_40 = 0;
  local_48 = (long *)operator_new(0x18);
  *local_48 = (long)&local_50;
  local_48[1] = in_RCX;
  local_48[2] = (long)&local_48;
  pcStack_30 = std::
               _Function_handler<void_(const___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_&,_const___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/luizalbertocviana[P]cracking-coding-problems/ch4/q2.cpp:21:22)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(const___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_&,_const___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/luizalbertocviana[P]cracking-coding-problems/ch4/q2.cpp:21:22)>
             ::_M_manager;
  std::
  __invoke_impl<void,bstree_from_sorted<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>(__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>const&,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>const&,int_const&)::_lambda(auto:1_const&,auto:2_const&)_1_&,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>const&,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>const&>
            (local_48,end,default_value);
  begin->_M_current = (int *)local_50;
  local_50._M_current = (int *)0x0;
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  if ((BSTreeNode *)local_50._M_current != (BSTreeNode *)0x0) {
    std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>::operator()
              ((default_delete<BSTree<const_int_&,_int>::BSTreeNode> *)&local_50,
               (BSTreeNode *)local_50._M_current);
  }
  return (BSTreeWithNode<BSTree<const_int_&,_int>::BSTreeNode>)
         (BSTreeWithNode<BSTree<const_int_&,_int>::BSTreeNode>)begin;
}

Assistant:

auto bstree_from_sorted(const Iterator& begin, const Iterator& end, const Val& default_value){
  // we are going to use Key as the type of elements within range
  // [begin, end)
  using Key      = decltype(*begin);
  // we are going to use a recursive function to perform the insertions
  using Function = std::function<void(const Iterator&, const Iterator&)>;

  // an empty BSTree
  BSTree<Key, Val> bst {};

  Function inserter {[&bst, &default_value, &inserter](const auto& begin, const auto& end) {
                       // if range is not empty
                       if (begin < end){
                         // we calculate half of the range length
                         auto length      {std::distance(begin, end)};
                         auto half_length {length / 2};

                         // we insert the middle element (odd length)
                         // or the first element of second half (even
                         // length)
                         bst.insert(*(begin + half_length), default_value);

                         // we recurse into each half, excluding the
                         // element that was just inserted
                         inserter(begin, begin + half_length);
                         inserter(begin + half_length + 1, end);
                       }
                     }};

  // we begin the insertion process to the whole range
  inserter(begin, end);

  // at the end, we return the BSTree
  return bst;
}